

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
pstd::
vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator=(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *other)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  if (this != other) {
    clear(this);
    reserve(this,other->nStored);
    uVar5 = other->nStored;
    if (uVar5 != 0) {
      lVar7 = 0;
      uVar6 = 0;
      do {
        pbVar2 = this->ptr;
        pcVar1 = (pbVar2->field_2)._M_local_buf + lVar7;
        pbVar3 = other->ptr;
        *(char **)(pcVar1 + -0x10) = pcVar1;
        lVar4 = *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar7);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&(pbVar2->_M_dataplus)._M_p + lVar7),lVar4,
                   *(long *)((long)&pbVar3->_M_string_length + lVar7) + lVar4);
        uVar6 = uVar6 + 1;
        uVar5 = other->nStored;
        lVar7 = lVar7 + 0x20;
      } while (uVar6 < uVar5);
    }
    this->nStored = uVar5;
  }
  return this;
}

Assistant:

vector &operator=(const vector &other) {
        if (this == &other)
            return *this;

        clear();
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            alloc.template construct<T>(ptr + i, other[i]);
        nStored = other.size();

        return *this;
    }